

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap_test.cpp
# Opt level: O3

void __thiscall
ot::commissioner::coap::CoapTest_CoapMessageHeader_TokenIsPresent_Test::TestBody
          (CoapTest_CoapMessageHeader_TokenIsPresent_Test *this)

{
  pointer puVar1;
  byte bVar2;
  byte bVar3;
  char *pcVar4;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  shared_ptr<ot::commissioner::coap::Message> message;
  Error error;
  ByteArray buffer;
  allocator_type local_aa;
  uchar local_a9;
  AssertHelper local_a8;
  undefined8 *local_a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_98;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_80;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  _Base_ptr local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  
  local_58._0_4_ = 0x41;
  local_58[4] = 0xfa;
  __l._M_len = 5;
  __l._M_array = local_68 + 0x10;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_30,__l,(allocator_type *)&local_80);
  local_58._0_4_ = 0;
  local_48 = (_Base_ptr)0x0;
  local_40._M_local_buf[0] = '\0';
  local_58._8_8_ = &local_40;
  Message::Deserialize((Message *)local_68,(Error *)(local_68 + 0x10),&local_30);
  local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  testing::internal::CmpHelperNE<std::shared_ptr<ot::commissioner::coap::Message>,decltype(nullptr)>
            ((internal *)&local_80,"message","nullptr",
             (shared_ptr<ot::commissioner::coap::Message> *)local_68,(void **)&local_98);
  if (local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ == (allocator_type)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar4 = anon_var_dwarf_4278be + 9;
    }
    else {
      pcVar4 = *(char **)local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0x80,pcVar4);
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    if ((long *)local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != (long *)0x0) {
      (**(code **)(*(long *)local_98.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  puVar1 = local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    if (*(pointer *)
         local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish !=
        local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish + 0x10) {
      operator_delete(*(pointer *)
                       local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
    }
    operator_delete(puVar1);
  }
  local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::ErrorCode>
            ((internal *)&local_80,"error","ErrorCode::kNone",(Error *)(local_68 + 0x10),
             (ErrorCode *)&local_98);
  if (local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ == (allocator_type)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar4 = anon_var_dwarf_4278be + 9;
    }
    else {
      pcVar4 = *(char **)local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0x81,pcVar4);
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    if ((long *)local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != (long *)0x0) {
      (**(code **)(*(long *)local_98.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  if (local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    if (*(pointer *)
         local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish !=
        local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish + 0x10) {
      operator_delete(*(pointer *)
                       local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
    }
    operator_delete(local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish);
  }
  bVar2 = *(byte *)(Header *)local_68._0_8_ >> 4;
  bVar3 = 8;
  if (bVar2 < 8) {
    bVar3 = bVar2;
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_80,
             ((Header *)local_68._0_8_)->mToken,((Header *)local_68._0_8_)->mToken + bVar3,
             (allocator_type *)&local_98);
  local_a9 = 0xfa;
  __l_00._M_len = 1;
  __l_00._M_array = &local_a9;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_98,__l_00,&local_aa);
  testing::internal::
  CmpHelperEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((internal *)&local_a8,"message->GetToken()","ByteArray{0xfa}",&local_80,&local_98);
  if ((long *)local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (long *)0x0) {
    operator_delete(local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((void *)CONCAT71(local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start._1_7_,
                       local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start._0_1_) != (void *)0x0) {
    operator_delete((void *)CONCAT71(local_80.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                     local_80.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_1_));
  }
  if (local_a8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_80);
    if (local_a0 == (undefined8 *)0x0) {
      pcVar4 = anon_var_dwarf_4278be + 9;
    }
    else {
      pcVar4 = (char *)*local_a0;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0x83,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if ((long *)CONCAT71(local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start._1_7_,
                         local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_80.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                     local_80.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_1_) + 8))();
    }
  }
  if (local_a0 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_a0 != local_a0 + 2) {
      operator_delete((undefined8 *)*local_a0);
    }
    operator_delete(local_a0);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._8_8_ != &local_40) {
    operator_delete((void *)local_58._8_8_);
  }
  if (local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(CoapTest, CoapMessageHeader_TokenIsPresent)
{
    ByteArray buffer{0x41, 0x00, 0x00, 0x00, 0xfa};
    Error     error;
    auto      message = Message::Deserialize(error, buffer);

    EXPECT_NE(message, nullptr);
    EXPECT_EQ(error, ErrorCode::kNone);

    EXPECT_EQ(message->GetToken(), ByteArray{0xfa});
}